

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_cleanup(archive_read *a)

{
  void *__ptr;
  long in_RDI;
  lha *lha;
  
  __ptr = (void *)**(undefined8 **)(in_RDI + 0x948);
  lzh_decode_free((lzh_stream *)0x141f0e);
  free(*(void **)((long)__ptr + 0x128));
  archive_string_free((archive_string *)0x141f30);
  archive_string_free((archive_string *)0x141f41);
  archive_string_free((archive_string *)0x141f52);
  archive_string_free((archive_string *)0x141f63);
  archive_wstring_free((archive_wstring *)0x141f74);
  free(__ptr);
  **(undefined8 **)(in_RDI + 0x948) = 0;
  return L'\0';
}

Assistant:

static int
archive_read_format_lha_cleanup(struct archive_read *a)
{
	struct lha *lha = (struct lha *)(a->format->data);

	lzh_decode_free(&(lha->strm));
	free(lha->uncompressed_buffer);
	archive_string_free(&(lha->dirname));
	archive_string_free(&(lha->filename));
	archive_string_free(&(lha->uname));
	archive_string_free(&(lha->gname));
	archive_wstring_free(&(lha->ws));
	free(lha);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}